

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void tricore_tr_translate_insn(DisasContextBase_conflict1 *dcbase,CPUState_conflict *cpu)

{
  TCGContext_conflict9 *tcg_ctx_00;
  CPUArchState_conflict28 *env_00;
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  DisasJumpType DVar4;
  int32_t size;
  uint32_t uVar5;
  uint uVar6;
  target_ulong_conflict page_start;
  uint32_t insn_hi;
  uint32_t insn_size;
  _Bool is_16bit;
  uint16_t insn_lo;
  CPUTriCoreState *env;
  TCGContext_conflict9 *tcg_ctx;
  uc_struct_conflict15 *uc;
  DisasContextBase_conflict1 *__mptr;
  DisasContext_conflict14 *ctx;
  CPUState_conflict *cpu_local;
  DisasContextBase_conflict1 *dcbase_local;
  
  tcg_ctx_00 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
  env_00 = (CPUArchState_conflict28 *)cpu->env_ptr;
  iVar3 = uc_addr_is_exit(*(uc_struct **)&dcbase[2].pc_first,(ulong)dcbase->pc_next);
  if (iVar3 == 0) {
    DVar4 = cpu_lduw_code_tricore(env_00,dcbase->pc_next);
    _Var1 = tricore_insn_is_16bit(DVar4 & 0xffff);
    size = 4;
    if (_Var1) {
      size = 2;
    }
    _Var2 = _hook_exists_bounded
                      (*(list_item **)(*(long *)&dcbase[2].pc_first + 0x358),(ulong)dcbase->pc_next)
    ;
    if (_Var2) {
      gen_save_pc((DisasContext_conflict14 *)dcbase,dcbase->pc_next);
      gen_uc_tracecode(tcg_ctx_00,size,2,*(void **)&dcbase[2].pc_first,(ulong)dcbase->pc_next);
      check_exit_request_tricore(tcg_ctx_00);
    }
    if (_Var1) {
      dcbase[1].is_jmp = DVar4 & 0xffff;
      dcbase[1].pc_next = dcbase->pc_next + 2;
      decode_16Bit_opc((DisasContext_conflict14 *)dcbase);
    }
    else {
      uVar5 = cpu_lduw_code_tricore(env_00,dcbase->pc_next + 2);
      dcbase[1].is_jmp = uVar5 << 0x10 | DVar4 & 0xffff;
      dcbase[1].pc_next = dcbase->pc_next + 4;
      decode_32Bit_opc((DisasContext_conflict14 *)dcbase);
    }
    dcbase->pc_next = dcbase[1].pc_next;
    if ((dcbase->is_jmp == DISAS_NEXT) &&
       ((uVar6 = dcbase->pc_first & 0xffffc000, 0x3fff < dcbase->pc_next - uVar6 ||
        ((0x3ffc < dcbase->pc_next - uVar6 &&
         (_Var1 = insn_crosses_page(env_00,(DisasContext_conflict14 *)dcbase), _Var1)))))) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  else {
    dcbase->is_jmp = DISAS_TARGET_6;
  }
  return;
}

Assistant:

static void tricore_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CPUTriCoreState *env = cpu->env_ptr;
    uint16_t insn_lo;
    bool is_16bit;
    uint32_t insn_size;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        ctx->base.is_jmp = DISAS_UC_EXIT;
    } else {
        insn_lo = cpu_lduw_code(env, ctx->base.pc_next);
        is_16bit = tricore_insn_is_16bit(insn_lo);

        insn_size = is_16bit ? 2 : 4;
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(ctx->uc, UC_HOOK_CODE, ctx->base.pc_next)) {
            // Sync PC in advance
            gen_save_pc(ctx, ctx->base.pc_next);

            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, ctx->uc,
                             ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        if (is_16bit) {
            ctx->opcode = insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 2;
            decode_16Bit_opc(ctx);
        } else {
            uint32_t insn_hi = cpu_lduw_code(env, ctx->base.pc_next + 2);
            ctx->opcode = insn_hi << 16 | insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 4;
            decode_32Bit_opc(ctx);
        }
        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE
                || (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE - 3
                    && insn_crosses_page(env, ctx))) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}